

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<std::complex<long_double>_>::EqnBackward
          (TPZEqnArray<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *U,
          DecomposeType dec)

{
  undefined8 *puVar1;
  longdouble lVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  complex<long_double> *pcVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  unkbyte10 in_ST0;
  unkbyte10 Var15;
  unkbyte10 in_ST1;
  longdouble lVar16;
  longdouble lVar17;
  unkbyte10 Var18;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  complex<long_double> __r;
  complex<long_double> local_58;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    if (1 < (long)this->fNumEq) {
      lVar10 = (long)this->fNumEq;
      do {
        piVar5 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        iVar3 = piVar5[lVar10 + -2];
        lVar11 = (long)iVar3;
        iVar4 = piVar5[lVar10 + -1];
        lVar16 = (longdouble)0;
        lVar17 = lVar16;
        Var15 = in_ST0;
        Var18 = in_ST1;
        if (iVar3 + 1 < iVar4) {
          lVar16 = (longdouble)0;
          lVar13 = lVar11;
          lVar17 = lVar16;
          lVar14 = lVar11 << 5;
          do {
            lVar12 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                           [lVar13 + 1];
            if (((lVar12 < 0) ||
                ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar12
                )) || ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1
                      )) {
              TPZFMatrix<std::complex<long_double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar6 = U->fElem + lVar12;
            local_58._M_value._0_8_ = *(undefined8 *)pcVar6->_M_value;
            uVar8 = *(undefined8 *)(pcVar6->_M_value + 8);
            puVar1 = (undefined8 *)(U->fElem[lVar12]._M_value + 0x10);
            local_58._M_value._16_8_ = *puVar1;
            uVar9 = puVar1[1];
            local_58._M_value._24_2_ = SUB82(uVar9,0);
            local_58._M_value._26_6_ = SUB86((ulong)uVar9 >> 0x10,0);
            local_58._M_value._8_2_ = SUB82(uVar8,0);
            local_58._M_value._10_6_ = SUB86((ulong)uVar8 >> 0x10,0);
            std::complex<long_double>::operator*=
                      (&local_58,
                       (complex<long_double> *)
                       ((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                        super_TPZVec<std::complex<long_double>_>.fStore[1]._M_value + lVar14));
            lVar17 = lVar17 - (longdouble)CONCAT28(local_58._M_value._8_2_,local_58._M_value._0_8_);
            lVar16 = lVar16 - (longdouble)
                              CONCAT28(local_58._M_value._24_2_,local_58._M_value._16_8_);
            lVar13 = lVar13 + 1;
            lVar14 = lVar14 + 0x20;
          } while (iVar4 + -1 != (int)lVar13);
        }
        lVar13 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar11]
        ;
        if (((lVar13 < 0) ||
            ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar13))
           || ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar6 = U->fElem;
        lVar2 = *(longdouble *)(pcVar6[lVar13]._M_value + 0x10);
        *(longdouble *)pcVar6[lVar13]._M_value = *(longdouble *)pcVar6[lVar13]._M_value + lVar17;
        *(longdouble *)(pcVar6[lVar13]._M_value + 0x10) = lVar2 + lVar16;
        in_ST0 = Var15;
        in_ST1 = Var18;
        if ((dec & ~ELUPivot) == ELU) {
          lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar11];
          if (((lVar11 < 0) ||
              ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar11))
             || ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar6 = U->fElem;
          in_ST0 = in_ST2;
          in_ST1 = in_ST3;
          in_ST2 = in_ST3;
          __divxc3();
          *(unkbyte10 *)pcVar6[lVar11]._M_value = Var15;
          *(unkbyte10 *)(pcVar6[lVar11]._M_value + 0x10) = Var18;
        }
        bVar7 = 3 < lVar10;
        lVar10 = lVar10 + -2;
      } while (bVar7);
    }
  }
  else if ((this->fSymmetric == EIsSymmetric) &&
          (lVar10 = (long)this->fNumEq, 0 < (long)this->fNumEq)) {
    do {
      piVar5 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      iVar3 = piVar5[lVar10 + -1];
      lVar11 = (long)iVar3;
      iVar4 = piVar5[lVar10];
      lVar16 = (longdouble)0;
      lVar17 = lVar16;
      Var15 = in_ST0;
      Var18 = in_ST1;
      if (iVar3 + 1 < iVar4) {
        lVar16 = (longdouble)0;
        lVar13 = lVar11;
        lVar17 = lVar16;
        lVar14 = lVar11 << 5;
        do {
          lVar12 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                         [lVar13 + 1];
          if (((lVar12 < 0) ||
              ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar12))
             || ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pcVar6 = U->fElem + lVar12;
          local_58._M_value._0_8_ = *(undefined8 *)pcVar6->_M_value;
          uVar8 = *(undefined8 *)(pcVar6->_M_value + 8);
          puVar1 = (undefined8 *)(U->fElem[lVar12]._M_value + 0x10);
          local_58._M_value._16_8_ = *puVar1;
          uVar9 = puVar1[1];
          local_58._M_value._24_2_ = SUB82(uVar9,0);
          local_58._M_value._26_6_ = SUB86((ulong)uVar9 >> 0x10,0);
          local_58._M_value._8_2_ = SUB82(uVar8,0);
          local_58._M_value._10_6_ = SUB86((ulong)uVar8 >> 0x10,0);
          std::complex<long_double>::operator*=
                    (&local_58,
                     (complex<long_double> *)
                     ((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                      super_TPZVec<std::complex<long_double>_>.fStore[1]._M_value + lVar14));
          lVar16 = lVar16 - (longdouble)CONCAT28(local_58._M_value._8_2_,local_58._M_value._0_8_);
          lVar17 = lVar17 - (longdouble)CONCAT28(local_58._M_value._24_2_,local_58._M_value._16_8_);
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 0x20;
        } while (iVar4 + -1 != (int)lVar13);
      }
      lVar13 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar11];
      if (((lVar13 < 0) ||
          ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar13)) ||
         ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<std::complex<long_double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pcVar6 = U->fElem;
      lVar2 = *(longdouble *)(pcVar6[lVar13]._M_value + 0x10);
      *(longdouble *)pcVar6[lVar13]._M_value = *(longdouble *)pcVar6[lVar13]._M_value + lVar16;
      *(longdouble *)(pcVar6[lVar13]._M_value + 0x10) = lVar2 + lVar17;
      in_ST0 = Var15;
      in_ST1 = Var18;
      if (dec == ECholesky) {
        lVar11 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar11]
        ;
        if (((lVar11 < 0) ||
            ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <= lVar11))
           || ((U->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pcVar6 = U->fElem;
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = in_ST3;
        __divxc3();
        *(unkbyte10 *)pcVar6[lVar11]._M_value = Var15;
        *(unkbyte10 *)(pcVar6[lVar11]._M_value + 0x10) = Var18;
      }
      bVar7 = 1 < lVar10;
      lVar10 = lVar10 + -1;
    } while (bVar7);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}